

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int32_t lookup_token(uint8_t *name,size_t namelen)

{
  undefined8 uVar1;
  uint8_t uVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  switch(namelen) {
  case 2:
    if ((name[1] == 'e') && (*name == 't')) {
      return 0x3d;
    }
    break;
  case 3:
    if (name[2] == 'e') {
      if (*(short *)name == 0x6761) {
        return 0x14;
      }
    }
    else if ((name[2] == 'a') && (*(short *)name == 0x6976)) {
      return 0x3b;
    }
    break;
  case 4:
    uVar2 = name[3];
    switch(uVar2) {
    case 'e':
      if (name[2] == 't' && *(short *)name == 0x6164) {
        return 0x20;
      }
      break;
    case 'f':
    case 'h':
    case 'i':
    case 'j':
    case 'l':
      break;
    case 'g':
      if (name[2] == 'a' && *(short *)name == 0x7465) {
        return 0x21;
      }
      break;
    case 'k':
      if (name[2] == 'n' && *(short *)name == 0x696c) {
        return 0x2c;
      }
      break;
    case 'm':
      if (name[2] == 'o' && *(short *)name == 0x7266) {
        return 0x24;
      }
      break;
    default:
      if (uVar2 == 't') {
        if (name[2] == 's' && *(short *)name == 0x6f68) {
          return 0x25;
        }
      }
      else if ((uVar2 == 'y') && (name[2] == 'r' && *(short *)name == 0x6176)) {
        return 0x3a;
      }
    }
    break;
  case 5:
    uVar2 = name[4];
    if (uVar2 == 'w') {
      if (*(int *)name == 0x6f6c6c61) {
        return 0x15;
      }
    }
    else if (uVar2 == 'h') {
      if (*(int *)name == 0x7461703a) {
        return 3;
      }
    }
    else if ((uVar2 == 'e') && (*(int *)name == 0x676e6172)) {
      return 0x31;
    }
    break;
  case 6:
    uVar2 = name[5];
    if (uVar2 == 't') {
      if (name[4] == 'p' && *(int *)name == 0x65636361) {
        return 0x12;
      }
      if (name[4] == 'c' && *(int *)name == 0x65707865) {
        return 0x22;
      }
    }
    else if (uVar2 == 'r') {
      if (name[4] == 'e' && *(int *)name == 0x76726573) {
        return 0x35;
      }
    }
    else if ((uVar2 == 'e') && (name[4] == 'i' && *(int *)name == 0x6b6f6f63)) {
      return 0x1f;
    }
    break;
  case 7:
    bVar3 = name[6];
    if (bVar3 < 0x68) {
      if (bVar3 == 100) {
        if (*(short *)(name + 4) == 0x6f68 && *(int *)name == 0x74656d3a) {
          return 1;
        }
      }
      else if (bVar3 == 0x65) {
        if (*(short *)(name + 4) == 0x6d65 && *(int *)name == 0x6863733a) {
          return 5;
        }
        if (*(short *)(name + 4) == 0x6461 && *(int *)name == 0x72677075) {
          return 0x41;
        }
      }
    }
    else if (bVar3 == 0x68) {
      if (*(short *)(name + 4) == 0x7365 && *(int *)name == 0x72666572) {
        return 0x33;
      }
    }
    else if (bVar3 == 0x72) {
      if (*(short *)(name + 4) == 0x6572 && *(int *)name == 0x65666572) {
        return 0x32;
      }
    }
    else if (bVar3 == 0x73) {
      if (*(short *)(name + 4) == 0x7574 && *(int *)name == 0x6174733a) {
        return 7;
      }
      if (*(short *)(name + 4) == 0x6572 && *(int *)name == 0x69707865) {
        return 0x23;
      }
    }
    break;
  case 8:
    bVar3 = name[7];
    if (bVar3 < 0x6e) {
      if (bVar3 == 0x65) {
        if (*(int *)(name + 3) == 0x676e6172 && *(int *)name == 0x722d6669) {
          return 0x29;
        }
      }
      else if ((bVar3 == 0x68) && (*(int *)(name + 3) == 0x6374616d && *(int *)name == 0x6d2d6669))
      {
        return 0x26;
      }
    }
    else if (bVar3 == 0x6e) {
      if (*(int *)(name + 3) == 0x6f697461 && *(int *)name == 0x61636f6c) {
        return 0x2d;
      }
    }
    else if ((bVar3 == 0x79) && (*(int *)(name + 3) == 0x7469726f && *(int *)name == 0x6f697270)) {
      return 0x43;
    }
    break;
  case 9:
    if ((name[8] == 'l') && (*(long *)name == 0x6f636f746f72703a)) {
      return 0x42;
    }
    break;
  case 10:
    bVar3 = name[9];
    if (bVar3 < 0x74) {
      if (bVar3 == 0x65) {
        if (name[8] == 'v' && *(long *)name == 0x696c612d7065656b) {
          return 0x3f;
        }
        if (name[8] == 'i' && *(long *)name == 0x6b6f6f632d746573) {
          return 0x36;
        }
      }
      else if ((bVar3 == 0x6e) && (name[8] == 'o' && *(long *)name == 0x697463656e6e6f63)) {
        return 0x3e;
      }
    }
    else if (bVar3 == 0x74) {
      if (name[8] == 'n' && *(long *)name == 0x6567612d72657375) {
        return 0x39;
      }
    }
    else if ((bVar3 == 0x79) && (name[8] == 't' && *(long *)name == 0x69726f687475613a)) {
      return 0;
    }
    break;
  case 0xb:
    if ((name[10] == 'r') && (*(short *)(name + 8) == 0x6574 && *(long *)name == 0x66612d7972746572)
       ) {
      return 0x34;
    }
    break;
  case 0xc:
    if (name[0xb] == 's') {
      if (*(long *)(name + 3) == 0x64726177726f662d && *(long *)name == 0x77726f662d78616d) {
        return 0x2e;
      }
    }
    else if ((name[0xb] == 'e') &&
            (*(long *)(name + 3) == 0x7079742d746e6574 && *(long *)name == 0x2d746e65746e6f63)) {
      return 0x1e;
    }
    break;
  case 0xd:
    switch(name[0xc]) {
    case 'd':
      if (*(int *)(name + 8) == 0x65696669 && *(long *)name == 0x646f6d2d7473616c) {
        return 0x2b;
      }
      break;
    case 'e':
      if (*(int *)(name + 8) == 0x676e6172 && *(long *)name == 0x2d746e65746e6f63) {
        return 0x1d;
      }
      break;
    case 'f':
    case 'g':
    case 'i':
    case 'j':
    case 'k':
    case 'm':
      break;
    case 'h':
      if (*(int *)(name + 8) == 0x6374616d && *(long *)name == 0x2d656e6f6e2d6669) {
        return 0x28;
      }
      break;
    case 'l':
      if (*(int *)(name + 8) == 0x6f72746e && *(long *)name == 0x6f632d6568636163) {
        return 0x17;
      }
      break;
    case 'n':
      if (*(int *)(name + 8) == 0x6f697461 && *(long *)name == 0x7a69726f68747561) {
        return 0x16;
      }
      break;
    default:
      if ((name[0xc] == 's') &&
         (*(int *)(name + 8) == 0x65676e61 && *(long *)name == 0x722d747065636361)) {
        return 0x11;
      }
    }
    break;
  case 0xe:
    if (name[0xd] == 't') {
      if (*(long *)(name + 5) == 0x6573726168632d74 && *(long *)name == 0x632d747065636361) {
        return 0xe;
      }
    }
    else if ((name[0xd] == 'h') &&
            (*(long *)(name + 5) == 0x74676e656c2d746e && *(long *)name == 0x2d746e65746e6f63)) {
      return 0x1b;
    }
    break;
  case 0xf:
    if (name[0xe] == 'g') {
      if (*(long *)(name + 6) == 0x6e69646f636e652d && *(long *)name == 0x652d747065636361) {
        return 0xf;
      }
    }
    else if ((name[0xe] == 'e') &&
            (*(long *)(name + 6) == 0x676175676e616c2d && *(long *)name == 0x6c2d747065636361)) {
      return 0x10;
    }
    break;
  case 0x10:
    uVar2 = name[0xf];
    if (uVar2 == 'n') {
      if (*(long *)(name + 7) == 0x6f697461636f6c2d && *(long *)name == 0x2d746e65746e6f63) {
        return 0x1c;
      }
      if (*(long *)(name + 7) == 0x6f697463656e6e6f && *(long *)name == 0x6f632d79786f7270) {
        return 0x40;
      }
    }
    else if (uVar2 == 'g') {
      if (*(long *)(name + 7) == 0x6e69646f636e652d && *(long *)name == 0x2d746e65746e6f63) {
        return 0x19;
      }
    }
    else if (uVar2 == 'e') {
      if (*(long *)(name + 7) == 0x676175676e616c2d && *(long *)name == 0x2d746e65746e6f63) {
        return 0x1a;
      }
      if (*(long *)(name + 7) == 0x74616369746e6568 && *(long *)name == 0x687475612d777777) {
        return 0x3c;
      }
    }
    break;
  case 0x11:
    if (name[0x10] == 'g') {
      auVar9[0] = -(*name == 't');
      auVar9[1] = -(name[1] == 'r');
      auVar9[2] = -(name[2] == 'a');
      auVar9[3] = -(name[3] == 'n');
      auVar9[4] = -(name[4] == 's');
      auVar9[5] = -(name[5] == 'f');
      auVar9[6] = -(name[6] == 'e');
      auVar9[7] = -(name[7] == 'r');
      auVar9[8] = -(name[8] == '-');
      auVar9[9] = -(name[9] == 'e');
      auVar9[10] = -(name[10] == 'n');
      auVar9[0xb] = -(name[0xb] == 'c');
      auVar9[0xc] = -(name[0xc] == 'o');
      auVar9[0xd] = -(name[0xd] == 'd');
      auVar9[0xe] = -(name[0xe] == 'i');
      auVar9[0xf] = -(name[0xf] == 'n');
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return 0x38;
      }
    }
    else if ((name[0x10] == 'e') &&
            (auVar6[0] = -(*name == 'i'), auVar6[1] = -(name[1] == 'f'),
            auVar6[2] = -(name[2] == '-'), auVar6[3] = -(name[3] == 'm'),
            auVar6[4] = -(name[4] == 'o'), auVar6[5] = -(name[5] == 'd'),
            auVar6[6] = -(name[6] == 'i'), auVar6[7] = -(name[7] == 'f'),
            auVar6[8] = -(name[8] == 'i'), auVar6[9] = -(name[9] == 'e'),
            auVar6[10] = -(name[10] == 'd'), auVar6[0xb] = -(name[0xb] == '-'),
            auVar6[0xc] = -(name[0xc] == 's'), auVar6[0xd] = -(name[0xd] == 'i'),
            auVar6[0xe] = -(name[0xe] == 'n'), auVar6[0xf] = -(name[0xf] == 'c'),
            (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) {
      return 0x27;
    }
    break;
  case 0x12:
    if ((name[0x11] == 'e') &&
       (auVar8[0] = -(*name == 'p'), auVar8[1] = -(name[1] == 'r'), auVar8[2] = -(name[2] == 'o'),
       auVar8[3] = -(name[3] == 'x'), auVar8[4] = -(name[4] == 'y'), auVar8[5] = -(name[5] == '-'),
       auVar8[6] = -(name[6] == 'a'), auVar8[7] = -(name[7] == 'u'), auVar8[8] = -(name[8] == 't'),
       auVar8[9] = -(name[9] == 'h'), auVar8[10] = -(name[10] == 'e'),
       auVar8[0xb] = -(name[0xb] == 'n'), auVar8[0xc] = -(name[0xc] == 't'),
       auVar8[0xd] = -(name[0xd] == 'i'), auVar8[0xe] = -(name[0xe] == 'c'),
       auVar8[0xf] = -(name[0xf] == 'a'), auVar15[0] = -(name[0x10] == 't'), auVar15[1] = 0xff,
       auVar15[2] = 0xff, auVar15[3] = 0xff, auVar15[4] = 0xff, auVar15[5] = 0xff, auVar15[6] = 0xff
       , auVar15[7] = 0xff, auVar15[8] = 0xff, auVar15[9] = 0xff, auVar15[10] = 0xff,
       auVar15[0xb] = 0xff, auVar15[0xc] = 0xff, auVar15[0xd] = 0xff, auVar15[0xe] = 0xff,
       auVar15[0xf] = 0xff, auVar15 = auVar15 & auVar8,
       (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff)) {
      return 0x2f;
    }
    break;
  case 0x13:
    if (name[0x12] == 'n') {
      auVar10[0] = -(*name == 'c');
      auVar10[1] = -(name[1] == 'o');
      auVar10[2] = -(name[2] == 'n');
      auVar10[3] = -(name[3] == 't');
      auVar10[4] = -(name[4] == 'e');
      auVar10[5] = -(name[5] == 'n');
      auVar10[6] = -(name[6] == 't');
      auVar10[7] = -(name[7] == '-');
      auVar10[8] = -(name[8] == 'd');
      auVar10[9] = -(name[9] == 'i');
      auVar10[10] = -(name[10] == 's');
      auVar10[0xb] = -(name[0xb] == 'p');
      auVar10[0xc] = -(name[0xc] == 'o');
      auVar10[0xd] = -(name[0xd] == 's');
      auVar10[0xe] = -(name[0xe] == 'i');
      auVar10[0xf] = -(name[0xf] == 't');
      auVar16[0] = -((char)*(undefined2 *)(name + 0x10) == 'i');
      auVar16[1] = -((char)((ushort)*(undefined2 *)(name + 0x10) >> 8) == 'o');
      auVar16[2] = 0xff;
      auVar16[3] = 0xff;
      auVar16[4] = 0xff;
      auVar16[5] = 0xff;
      auVar16[6] = 0xff;
      auVar16[7] = 0xff;
      auVar16[8] = 0xff;
      auVar16[9] = 0xff;
      auVar16[10] = 0xff;
      auVar16[0xb] = 0xff;
      auVar16[0xc] = 0xff;
      auVar16[0xd] = 0xff;
      auVar16[0xe] = 0xff;
      auVar16[0xf] = 0xff;
      auVar16 = auVar16 & auVar10;
      if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
        return 0x18;
      }
      auVar11[0] = -(*name == 'p');
      auVar11[1] = -(name[1] == 'r');
      auVar11[2] = -(name[2] == 'o');
      auVar11[3] = -(name[3] == 'x');
      auVar11[4] = -(name[4] == 'y');
      auVar11[5] = -(name[5] == '-');
      auVar11[6] = -(name[6] == 'a');
      auVar11[7] = -(name[7] == 'u');
      auVar11[8] = -(name[8] == 't');
      auVar11[9] = -(name[9] == 'h');
      auVar11[10] = -(name[10] == 'o');
      auVar11[0xb] = -(name[0xb] == 'r');
      auVar11[0xc] = -(name[0xc] == 'i');
      auVar11[0xd] = -(name[0xd] == 'z');
      auVar11[0xe] = -(name[0xe] == 'a');
      auVar11[0xf] = -(name[0xf] == 't');
      auVar17[0] = -((char)*(undefined2 *)(name + 0x10) == 'i');
      auVar17[1] = -((char)((ushort)*(undefined2 *)(name + 0x10) >> 8) == 'o');
      auVar17[2] = 0xff;
      auVar17[3] = 0xff;
      auVar17[4] = 0xff;
      auVar17[5] = 0xff;
      auVar17[6] = 0xff;
      auVar17[7] = 0xff;
      auVar17[8] = 0xff;
      auVar17[9] = 0xff;
      auVar17[10] = 0xff;
      auVar17[0xb] = 0xff;
      auVar17[0xc] = 0xff;
      auVar17[0xd] = 0xff;
      auVar17[0xe] = 0xff;
      auVar17[0xf] = 0xff;
      auVar17 = auVar17 & auVar11;
      if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
        return 0x30;
      }
    }
    else if ((name[0x12] == 'e') &&
            (auVar7[0] = -(*name == 'i'), auVar7[1] = -(name[1] == 'f'),
            auVar7[2] = -(name[2] == '-'), auVar7[3] = -(name[3] == 'u'),
            auVar7[4] = -(name[4] == 'n'), auVar7[5] = -(name[5] == 'm'),
            auVar7[6] = -(name[6] == 'o'), auVar7[7] = -(name[7] == 'd'),
            auVar7[8] = -(name[8] == 'i'), auVar7[9] = -(name[9] == 'f'),
            auVar7[10] = -(name[10] == 'i'), auVar7[0xb] = -(name[0xb] == 'e'),
            auVar7[0xc] = -(name[0xc] == 'd'), auVar7[0xd] = -(name[0xd] == '-'),
            auVar7[0xe] = -(name[0xe] == 's'), auVar7[0xf] = -(name[0xf] == 'i'),
            auVar14[0] = -((char)*(undefined2 *)(name + 0x10) == 'n'),
            auVar14[1] = -((char)((ushort)*(undefined2 *)(name + 0x10) >> 8) == 'c'),
            auVar14[2] = 0xff, auVar14[3] = 0xff, auVar14[4] = 0xff, auVar14[5] = 0xff,
            auVar14[6] = 0xff, auVar14[7] = 0xff, auVar14[8] = 0xff, auVar14[9] = 0xff,
            auVar14[10] = 0xff, auVar14[0xb] = 0xff, auVar14[0xc] = 0xff, auVar14[0xd] = 0xff,
            auVar14[0xe] = 0xff, auVar14[0xf] = 0xff, auVar14 = auVar14 & auVar7,
            (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff)) {
      return 0x2a;
    }
    break;
  case 0x19:
    if (name[0x18] == 'y') {
      uVar1 = *(undefined8 *)(name + 0x10);
      auVar12[0] = -((char)uVar1 == '-');
      auVar12[1] = -((char)((ulong)uVar1 >> 8) == 's');
      auVar12[2] = -((char)((ulong)uVar1 >> 0x10) == 'e');
      auVar12[3] = -((char)((ulong)uVar1 >> 0x18) == 'c');
      auVar12[4] = -((char)((ulong)uVar1 >> 0x20) == 'u');
      auVar12[5] = -((char)((ulong)uVar1 >> 0x28) == 'r');
      auVar12[6] = -((char)((ulong)uVar1 >> 0x30) == 'i');
      auVar12[7] = -((char)((ulong)uVar1 >> 0x38) == 't');
      auVar12[8] = 0xff;
      auVar12[9] = 0xff;
      auVar12[10] = 0xff;
      auVar12[0xb] = 0xff;
      auVar12[0xc] = 0xff;
      auVar12[0xd] = 0xff;
      auVar12[0xe] = 0xff;
      auVar12[0xf] = 0xff;
      auVar4[0] = -(*name == 's');
      auVar4[1] = -(name[1] == 't');
      auVar4[2] = -(name[2] == 'r');
      auVar4[3] = -(name[3] == 'i');
      auVar4[4] = -(name[4] == 'c');
      auVar4[5] = -(name[5] == 't');
      auVar4[6] = -(name[6] == '-');
      auVar4[7] = -(name[7] == 't');
      auVar4[8] = -(name[8] == 'r');
      auVar4[9] = -(name[9] == 'a');
      auVar4[10] = -(name[10] == 'n');
      auVar4[0xb] = -(name[0xb] == 's');
      auVar4[0xc] = -(name[0xc] == 'p');
      auVar4[0xd] = -(name[0xd] == 'o');
      auVar4[0xe] = -(name[0xe] == 'r');
      auVar4[0xf] = -(name[0xf] == 't');
      auVar4 = auVar4 & auVar12;
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
        return 0x37;
      }
    }
    break;
  case 0x1b:
    if ((name[0x1a] == 'n') &&
       (auVar13[0] = -(name[10] == 't'), auVar13[1] = -(name[0xb] == 'r'),
       auVar13[2] = -(name[0xc] == 'o'), auVar13[3] = -(name[0xd] == 'l'),
       auVar13[4] = -(name[0xe] == '-'), auVar13[5] = -(name[0xf] == 'a'),
       auVar13[6] = -(name[0x10] == 'l'), auVar13[7] = -(name[0x11] == 'l'),
       auVar13[8] = -(name[0x12] == 'o'), auVar13[9] = -(name[0x13] == 'w'),
       auVar13[10] = -(name[0x14] == '-'), auVar13[0xb] = -(name[0x15] == 'o'),
       auVar13[0xc] = -(name[0x16] == 'r'), auVar13[0xd] = -(name[0x17] == 'i'),
       auVar13[0xe] = -(name[0x18] == 'g'), auVar13[0xf] = -(name[0x19] == 'i'),
       auVar5[0] = -(*name == 'a'), auVar5[1] = -(name[1] == 'c'), auVar5[2] = -(name[2] == 'c'),
       auVar5[3] = -(name[3] == 'e'), auVar5[4] = -(name[4] == 's'), auVar5[5] = -(name[5] == 's'),
       auVar5[6] = -(name[6] == '-'), auVar5[7] = -(name[7] == 'c'), auVar5[8] = -(name[8] == 'o'),
       auVar5[9] = -(name[9] == 'n'), auVar5[10] = -(name[10] == 't'),
       auVar5[0xb] = -(name[0xb] == 'r'), auVar5[0xc] = -(name[0xc] == 'o'),
       auVar5[0xd] = -(name[0xd] == 'l'), auVar5[0xe] = -(name[0xe] == '-'),
       auVar5[0xf] = -(name[0xf] == 'a'), auVar5 = auVar5 & auVar13,
       (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff)) {
      return 0x13;
    }
  }
  return -1;
}

Assistant:

static int32_t lookup_token(const uint8_t *name, size_t namelen) {
  switch (namelen) {
  case 2:
    switch (name[1]) {
    case 'e':
      if (memeq("t", name, 1)) {
        return NGHTTP2_TOKEN_TE;
      }
      break;
    }
    break;
  case 3:
    switch (name[2]) {
    case 'a':
      if (memeq("vi", name, 2)) {
        return NGHTTP2_TOKEN_VIA;
      }
      break;
    case 'e':
      if (memeq("ag", name, 2)) {
        return NGHTTP2_TOKEN_AGE;
      }
      break;
    }
    break;
  case 4:
    switch (name[3]) {
    case 'e':
      if (memeq("dat", name, 3)) {
        return NGHTTP2_TOKEN_DATE;
      }
      break;
    case 'g':
      if (memeq("eta", name, 3)) {
        return NGHTTP2_TOKEN_ETAG;
      }
      break;
    case 'k':
      if (memeq("lin", name, 3)) {
        return NGHTTP2_TOKEN_LINK;
      }
      break;
    case 'm':
      if (memeq("fro", name, 3)) {
        return NGHTTP2_TOKEN_FROM;
      }
      break;
    case 't':
      if (memeq("hos", name, 3)) {
        return NGHTTP2_TOKEN_HOST;
      }
      break;
    case 'y':
      if (memeq("var", name, 3)) {
        return NGHTTP2_TOKEN_VARY;
      }
      break;
    }
    break;
  case 5:
    switch (name[4]) {
    case 'e':
      if (memeq("rang", name, 4)) {
        return NGHTTP2_TOKEN_RANGE;
      }
      break;
    case 'h':
      if (memeq(":pat", name, 4)) {
        return NGHTTP2_TOKEN__PATH;
      }
      break;
    case 'w':
      if (memeq("allo", name, 4)) {
        return NGHTTP2_TOKEN_ALLOW;
      }
      break;
    }
    break;
  case 6:
    switch (name[5]) {
    case 'e':
      if (memeq("cooki", name, 5)) {
        return NGHTTP2_TOKEN_COOKIE;
      }
      break;
    case 'r':
      if (memeq("serve", name, 5)) {
        return NGHTTP2_TOKEN_SERVER;
      }
      break;
    case 't':
      if (memeq("accep", name, 5)) {
        return NGHTTP2_TOKEN_ACCEPT;
      }
      if (memeq("expec", name, 5)) {
        return NGHTTP2_TOKEN_EXPECT;
      }
      break;
    }
    break;
  case 7:
    switch (name[6]) {
    case 'd':
      if (memeq(":metho", name, 6)) {
        return NGHTTP2_TOKEN__METHOD;
      }
      break;
    case 'e':
      if (memeq(":schem", name, 6)) {
        return NGHTTP2_TOKEN__SCHEME;
      }
      if (memeq("upgrad", name, 6)) {
        return NGHTTP2_TOKEN_UPGRADE;
      }
      break;
    case 'h':
      if (memeq("refres", name, 6)) {
        return NGHTTP2_TOKEN_REFRESH;
      }
      break;
    case 'r':
      if (memeq("refere", name, 6)) {
        return NGHTTP2_TOKEN_REFERER;
      }
      break;
    case 's':
      if (memeq(":statu", name, 6)) {
        return NGHTTP2_TOKEN__STATUS;
      }
      if (memeq("expire", name, 6)) {
        return NGHTTP2_TOKEN_EXPIRES;
      }
      break;
    }
    break;
  case 8:
    switch (name[7]) {
    case 'e':
      if (memeq("if-rang", name, 7)) {
        return NGHTTP2_TOKEN_IF_RANGE;
      }
      break;
    case 'h':
      if (memeq("if-matc", name, 7)) {
        return NGHTTP2_TOKEN_IF_MATCH;
      }
      break;
    case 'n':
      if (memeq("locatio", name, 7)) {
        return NGHTTP2_TOKEN_LOCATION;
      }
      break;
    case 'y':
      if (memeq("priorit", name, 7)) {
        return NGHTTP2_TOKEN_PRIORITY;
      }
      break;
    }
    break;
  case 9:
    switch (name[8]) {
    case 'l':
      if (memeq(":protoco", name, 8)) {
        return NGHTTP2_TOKEN__PROTOCOL;
      }
      break;
    }
    break;
  case 10:
    switch (name[9]) {
    case 'e':
      if (memeq("keep-aliv", name, 9)) {
        return NGHTTP2_TOKEN_KEEP_ALIVE;
      }
      if (memeq("set-cooki", name, 9)) {
        return NGHTTP2_TOKEN_SET_COOKIE;
      }
      break;
    case 'n':
      if (memeq("connectio", name, 9)) {
        return NGHTTP2_TOKEN_CONNECTION;
      }
      break;
    case 't':
      if (memeq("user-agen", name, 9)) {
        return NGHTTP2_TOKEN_USER_AGENT;
      }
      break;
    case 'y':
      if (memeq(":authorit", name, 9)) {
        return NGHTTP2_TOKEN__AUTHORITY;
      }
      break;
    }
    break;
  case 11:
    switch (name[10]) {
    case 'r':
      if (memeq("retry-afte", name, 10)) {
        return NGHTTP2_TOKEN_RETRY_AFTER;
      }
      break;
    }
    break;
  case 12:
    switch (name[11]) {
    case 'e':
      if (memeq("content-typ", name, 11)) {
        return NGHTTP2_TOKEN_CONTENT_TYPE;
      }
      break;
    case 's':
      if (memeq("max-forward", name, 11)) {
        return NGHTTP2_TOKEN_MAX_FORWARDS;
      }
      break;
    }
    break;
  case 13:
    switch (name[12]) {
    case 'd':
      if (memeq("last-modifie", name, 12)) {
        return NGHTTP2_TOKEN_LAST_MODIFIED;
      }
      break;
    case 'e':
      if (memeq("content-rang", name, 12)) {
        return NGHTTP2_TOKEN_CONTENT_RANGE;
      }
      break;
    case 'h':
      if (memeq("if-none-matc", name, 12)) {
        return NGHTTP2_TOKEN_IF_NONE_MATCH;
      }
      break;
    case 'l':
      if (memeq("cache-contro", name, 12)) {
        return NGHTTP2_TOKEN_CACHE_CONTROL;
      }
      break;
    case 'n':
      if (memeq("authorizatio", name, 12)) {
        return NGHTTP2_TOKEN_AUTHORIZATION;
      }
      break;
    case 's':
      if (memeq("accept-range", name, 12)) {
        return NGHTTP2_TOKEN_ACCEPT_RANGES;
      }
      break;
    }
    break;
  case 14:
    switch (name[13]) {
    case 'h':
      if (memeq("content-lengt", name, 13)) {
        return NGHTTP2_TOKEN_CONTENT_LENGTH;
      }
      break;
    case 't':
      if (memeq("accept-charse", name, 13)) {
        return NGHTTP2_TOKEN_ACCEPT_CHARSET;
      }
      break;
    }
    break;
  case 15:
    switch (name[14]) {
    case 'e':
      if (memeq("accept-languag", name, 14)) {
        return NGHTTP2_TOKEN_ACCEPT_LANGUAGE;
      }
      break;
    case 'g':
      if (memeq("accept-encodin", name, 14)) {
        return NGHTTP2_TOKEN_ACCEPT_ENCODING;
      }
      break;
    }
    break;
  case 16:
    switch (name[15]) {
    case 'e':
      if (memeq("content-languag", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_LANGUAGE;
      }
      if (memeq("www-authenticat", name, 15)) {
        return NGHTTP2_TOKEN_WWW_AUTHENTICATE;
      }
      break;
    case 'g':
      if (memeq("content-encodin", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_ENCODING;
      }
      break;
    case 'n':
      if (memeq("content-locatio", name, 15)) {
        return NGHTTP2_TOKEN_CONTENT_LOCATION;
      }
      if (memeq("proxy-connectio", name, 15)) {
        return NGHTTP2_TOKEN_PROXY_CONNECTION;
      }
      break;
    }
    break;
  case 17:
    switch (name[16]) {
    case 'e':
      if (memeq("if-modified-sinc", name, 16)) {
        return NGHTTP2_TOKEN_IF_MODIFIED_SINCE;
      }
      break;
    case 'g':
      if (memeq("transfer-encodin", name, 16)) {
        return NGHTTP2_TOKEN_TRANSFER_ENCODING;
      }
      break;
    }
    break;
  case 18:
    switch (name[17]) {
    case 'e':
      if (memeq("proxy-authenticat", name, 17)) {
        return NGHTTP2_TOKEN_PROXY_AUTHENTICATE;
      }
      break;
    }
    break;
  case 19:
    switch (name[18]) {
    case 'e':
      if (memeq("if-unmodified-sinc", name, 18)) {
        return NGHTTP2_TOKEN_IF_UNMODIFIED_SINCE;
      }
      break;
    case 'n':
      if (memeq("content-dispositio", name, 18)) {
        return NGHTTP2_TOKEN_CONTENT_DISPOSITION;
      }
      if (memeq("proxy-authorizatio", name, 18)) {
        return NGHTTP2_TOKEN_PROXY_AUTHORIZATION;
      }
      break;
    }
    break;
  case 25:
    switch (name[24]) {
    case 'y':
      if (memeq("strict-transport-securit", name, 24)) {
        return NGHTTP2_TOKEN_STRICT_TRANSPORT_SECURITY;
      }
      break;
    }
    break;
  case 27:
    switch (name[26]) {
    case 'n':
      if (memeq("access-control-allow-origi", name, 26)) {
        return NGHTTP2_TOKEN_ACCESS_CONTROL_ALLOW_ORIGIN;
      }
      break;
    }
    break;
  }
  return -1;
}